

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O1

Boolean MA_init_memhandle_iterator(Integer *ithandle)

{
  ma_stats.calls[0xc] = ma_stats.calls[0xc] + 1;
  builtin_strncpy(ma_ebuf,"not yet implemented",0x14);
  ma_error(EL_Nonfatal,ET_External,"MA_init_memhandle_iterator",ma_ebuf);
  return 0;
}

Assistant:

public Boolean MA_init_memhandle_iterator( Integer *ithandle)
{
#ifdef STATS
    ma_stats.calls[(int)FID_MA_init_memhandle_iterator]++;
#endif /* STATS */

#ifdef VERIFY
    if (ma_auto_verify && !MA_verify_allocator_stuff())
        return MA_FALSE;
#endif /* VERIFY */

    /* not yet implemented */
    (void)sprintf(ma_ebuf,
        "not yet implemented");
    ma_error(EL_Nonfatal, ET_External, "MA_init_memhandle_iterator", ma_ebuf);
    return MA_FALSE;
}